

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O2

OptError * __thiscall
multihash::decode_abi_cxx11_
          (OptError *__return_storage_ptr__,multihash *this,Bytes *buf,Multihash *m)

{
  UInt code_00;
  bool bVar1;
  Bytes *buf_00;
  undefined1 *puVar2;
  ulong length_00;
  UInt length;
  UInt code;
  OptError err;
  uint local_b8;
  UInt local_b4;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined1 local_70 [48];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  UInt *local_38;
  
  if ((ulong)(*(long *)(this + 8) - *(long *)this) < 2) {
    std::_Optional_payload_base<std::__cxx11::string>::
    _Optional_payload_base<std::__cxx11::string_const&>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,
               errTooShort_abi_cxx11_);
    return __return_storage_ptr__;
  }
  local_b4 = 0;
  local_b8 = 0;
  local_b0._M_engaged = false;
  binary::uvarint_abi_cxx11_
            ((tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70,(binary *)this,buf);
  local_38 = &local_b4;
  local_40 = &local_b0;
  std::tuple<unsigned_int&,std::optional<std::__cxx11::string>&>::operator=
            ((tuple<unsigned_int&,std::optional<std::__cxx11::string>&> *)&local_40,
             (tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_70);
  if (local_b0._M_engaged != true) {
    binary::uvarint_abi_cxx11_
              ((tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70,(binary *)this,buf_00);
    local_40 = &local_b0;
    local_38 = &local_b8;
    std::tuple<unsigned_int&,std::optional<std::__cxx11::string>&>::operator=
              ((tuple<unsigned_int&,std::optional<std::__cxx11::string>&> *)&local_40,
               (tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70);
    if (local_b0._M_engaged != true) {
      if (*(long *)(this + 8) - *(long *)this == (ulong)local_b8) {
        bVar1 = validate(0);
        code_00 = local_b4;
        if (bVar1) {
          length_00 = (ulong)local_b8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
          Multihash::Multihash((Multihash *)local_70,code_00,length_00,(Bytes *)&local_88);
          Multihash::operator=((Multihash *)buf,(Multihash *)local_70);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (local_70 + 0x10));
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88)
          ;
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          goto LAB_0010e523;
        }
        puVar2 = errUnknownHashCode_abi_cxx11_;
      }
      else {
        puVar2 = errInconsistantLength_abi_cxx11_;
      }
      std::_Optional_payload_base<std::__cxx11::string>::
      _Optional_payload_base<std::__cxx11::string_const&>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,puVar2);
      goto LAB_0010e523;
    }
  }
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base(&__return_storage_ptr__->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     *)&local_b0);
LAB_0010e523:
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

OptError decode(Bytes &buf, Multihash &m) {
	if (buf.size() < 2) {
		return errTooShort;
	}

	UInt code{};
	UInt length{};
	OptError err{};

	std::tie(code, err) = binary::uvarint(buf);
	if (err) {
		return err;
	}

	std::tie(length, err) = binary::uvarint(buf);
	if (err) {
		return err;
	}

	if (buf.size() != length) {
		return errInconsistantLength;
	}

	if (!validate(code)) {
		return errUnknownHashCode;
	}

	m = Multihash{code, length, buf};
	return std::nullopt;
}